

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void gray_record_cell(PWorker worker)

{
  PCell_conflict pTVar1;
  PCell_conflict cell;
  PWorker worker_local;
  
  if (worker->area != 0 || worker->cover != 0) {
    pTVar1 = gray_find_cell(worker);
    pTVar1->area = worker->area + pTVar1->area;
    pTVar1->cover = worker->cover + pTVar1->cover;
  }
  return;
}

Assistant:

static void
  gray_record_cell( RAS_ARG )
  {
    if ( ras.area | ras.cover )
    {
      PCell  cell = gray_find_cell( RAS_VAR );


      cell->area  += ras.area;
      cell->cover += ras.cover;
    }
  }